

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxFlopFunctionCall::Resolve(FxFlopFunctionCall *this,FCompileContext *ctx)

{
  FArgumentList *pFVar1;
  FxExpression *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  FxConstant *this_01;
  FxFloatCast *this_02;
  double dVar4;
  ExpVal local_20;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    pFVar1 = this->ArgList;
    if ((pFVar1 == (FArgumentList *)0x0) ||
       ((pFVar1->super_TArray<FxExpression_*,_FxExpression_*>).Count != 1)) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"%s only has one parameter",
                 FName::NameData.NameArray
                 [(int)FxFlops[*(int *)&(this->super_FxExpression).field_0x34].Name].Text);
    }
    else {
      iVar3 = (*(*(pFVar1->super_TArray<FxExpression_*,_FxExpression_*>).Array)->_vptr_FxExpression
                [2])();
      *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array =
           (FxExpression *)CONCAT44(extraout_var,iVar3);
      this_00 = *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array;
      if (this_00 != (FxExpression *)0x0) {
        bVar2 = FxExpression::IsNumeric(this_00);
        if (bVar2) {
          iVar3 = (*(*(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array)->
                    _vptr_FxExpression[3])();
          if ((char)iVar3 != '\0') {
            ExpVal::ExpVal(&local_20,
                           (ExpVal *)
                           (*(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array + 1
                           ));
            dVar4 = ExpVal::GetFloat(&local_20);
            ExpVal::~ExpVal(&local_20);
            dVar4 = (*FxFlops[*(int *)&(this->super_FxExpression).field_0x34].Evaluate)(dVar4);
            this_01 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant(this_01,dVar4,&(this->super_FxExpression).ScriptPosition);
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            return &this_01->super_FxExpression;
          }
          iVar3 = (*((*(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array)->
                     ValueType->super_DObject)._vptr_DObject[0x12])();
          if (iVar3 == 0) {
            this_02 = (FxFloatCast *)operator_new(0x40);
            FxFloatCast::FxFloatCast
                      (this_02,*(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array)
            ;
            *(this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>).Array =
                 (FxExpression *)this_02;
          }
          (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
          return &this->super_FxExpression;
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "numeric value expected for parameter");
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxFlopFunctionCall *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxFlopFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	if (ArgList == NULL || ArgList->Size() != 1)
	{
		ScriptPosition.Message(MSG_ERROR, "%s only has one parameter", FName(FxFlops[Index].Name).GetChars());
		delete this;
		return NULL;
	}

	(*ArgList)[0] = (*ArgList)[0]->Resolve(ctx);
	if ((*ArgList)[0] == NULL)
	{
		delete this;
		return NULL;
	}

	if (!(*ArgList)[0]->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "numeric value expected for parameter");
		delete this;
		return NULL;
	}
	if ((*ArgList)[0]->isConstant())
	{
		double v = static_cast<FxConstant *>((*ArgList)[0])->GetValue().GetFloat();
		v = FxFlops[Index].Evaluate(v);
		FxExpression *x = new FxConstant(v, ScriptPosition);
		delete this;
		return x;
	}
	if ((*ArgList)[0]->ValueType->GetRegType() == REGT_INT)
	{
		(*ArgList)[0] = new FxFloatCast((*ArgList)[0]);
	}
	ValueType = TypeFloat64;
	return this;
}